

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O1

int __thiscall
glcts::SampleShadingRenderFormatTests::init(SampleShadingRenderFormatTests *this,EVP_PKEY_CTX *ctx)

{
  TextureFormat *texFormat;
  int extraout_EAX;
  SampleShadingRenderCase *pSVar1;
  
  pSVar1 = (SampleShadingRenderCase *)operator_new(0x108);
  texFormat = &this->m_texFormat;
  SampleShadingRenderCase::SampleShadingRenderCase
            (pSVar1,(this->super_TestCaseGroup).m_context,"full","Sample shader functionality",
             this->m_glslVersion,this->m_internalFormat,texFormat,(this->m_sampler)._M_dataplus._M_p
             ,(this->m_outType)._M_dataplus._M_p,this->m_min,this->m_max,
             (this->m_extension)._M_dataplus._M_p,1.0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SampleShadingRenderCase *)operator_new(0x108);
  SampleShadingRenderCase::SampleShadingRenderCase
            (pSVar1,(this->super_TestCaseGroup).m_context,"half","Sample shader functionality",
             this->m_glslVersion,this->m_internalFormat,texFormat,(this->m_sampler)._M_dataplus._M_p
             ,(this->m_outType)._M_dataplus._M_p,this->m_min,this->m_max,
             (this->m_extension)._M_dataplus._M_p,0.5);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SampleShadingRenderCase *)operator_new(0x108);
  SampleShadingRenderCase::SampleShadingRenderCase
            (pSVar1,(this->super_TestCaseGroup).m_context,"none","Sample shader functionality",
             this->m_glslVersion,this->m_internalFormat,texFormat,(this->m_sampler)._M_dataplus._M_p
             ,(this->m_outType)._M_dataplus._M_p,this->m_min,this->m_max,
             (this->m_extension)._M_dataplus._M_p,0.0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  return extraout_EAX;
}

Assistant:

void SampleShadingRenderFormatTests::init(void)
{
	// sample_shading.render.full
	addChild(new SampleShadingRenderCase(m_context, "full", "Sample shader functionality", m_glslVersion,
										 m_internalFormat, m_texFormat, m_sampler.c_str(), m_outType.c_str(), m_min,
										 m_max, m_extension.c_str(), 1.0));
	// sample_shading.render.half
	addChild(new SampleShadingRenderCase(m_context, "half", "Sample shader functionality", m_glslVersion,
										 m_internalFormat, m_texFormat, m_sampler.c_str(), m_outType.c_str(), m_min,
										 m_max, m_extension.c_str(), 0.5));
	// sample_shading.render.none
	addChild(new SampleShadingRenderCase(m_context, "none", "Sample shader functionality", m_glslVersion,
										 m_internalFormat, m_texFormat, m_sampler.c_str(), m_outType.c_str(), m_min,
										 m_max, m_extension.c_str(), 0.0));
}